

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::array_matcher<json_out_callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
           *__return_storage_ptr__,array_matcher<json_out_callbacks> *this,
          parser<json_out_callbacks> *parser,maybe<char,_void> *ch)

{
  byte bVar1;
  int iVar2;
  _Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false> _Var3;
  undefined1 auVar4 [16];
  bool bVar5;
  byte *pbVar6;
  ulong uVar7;
  error_category *peVar8;
  error_code err;
  
  if (ch->valid_ == false) {
LAB_001376e7:
    peVar8 = get_error_category();
    err._M_cat = peVar8;
    err._0_8_ = 1;
    bVar5 = parser<json_out_callbacks>::set_error(parser,err);
    if (bVar5) {
LAB_00137700:
      (this->super_matcher<json_out_callbacks>).state_ = 1;
    }
LAB_00137708:
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
         = 1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl
         = (matcher<json_out_callbacks> *)0x0;
LAB_00137717:
    bVar5 = true;
  }
  else {
    pbVar6 = (byte *)maybe<char,_void>::operator->(ch);
    iVar2 = (this->super_matcher<json_out_callbacks>).state_;
    if (4 < iVar2 - 1U) goto LAB_00137708;
    bVar1 = *pbVar6;
    switch(iVar2) {
    case 1:
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x4c6);
    case 2:
      if (bVar1 != 0x5b) {
        assert_failed("c == \'[\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x4a3);
      }
      json_out_callbacks::append<char_const(&)[2]>(&parser->callbacks_,(char (*) [2])0x191a80);
      uVar7 = std::_V2::system_category();
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar7;
      bVar5 = parser<json_out_callbacks>::set_error(parser,(error_code)(auVar4 << 0x40));
      if (bVar5) goto LAB_00137700;
      (this->super_matcher<json_out_callbacks>).state_ = 3;
LAB_001376b3:
      _Var3._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
      ((_Var3._M_head_impl)->terminal).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bcd20;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
      _M_head_impl = (matcher<json_out_callbacks> *)&(_Var3._M_head_impl)->terminal;
      goto LAB_00137717;
    case 3:
      if (bVar1 == 0x5d) goto LAB_001376da;
    case 4:
      (this->super_matcher<json_out_callbacks>).state_ = 5;
      _Var3._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)&(_Var3._M_head_impl)->root + 8) = 2;
      ((_Var3._M_head_impl)->root).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bcd60;
      bVar5 = false;
      *(undefined1 *)((long)&(_Var3._M_head_impl)->root + 0xc) = 0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
      _M_head_impl = (matcher<json_out_callbacks> *)&(_Var3._M_head_impl)->root;
      break;
    case 5:
      if (bVar1 < 0x2d) {
        if ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
          _Var3._M_head_impl =
               (parser->singletons_)._M_t.
               super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
               .
               super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
               ._M_head_impl;
          *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
          ((_Var3._M_head_impl)->terminal).__align =
               (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bcd20;
          (__return_storage_ptr__->first)._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
          .
          super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
          .
          super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
               = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
                  )0x0;
          (__return_storage_ptr__->first)._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
          .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
          _M_head_impl = (matcher<json_out_callbacks> *)&(_Var3._M_head_impl)->terminal;
          bVar5 = false;
          break;
        }
        if ((ulong)bVar1 == 0x2c) {
          (this->super_matcher<json_out_callbacks>).state_ =
               ((parser->extensions_ & array_trailing_comma) == none) + 3;
          goto LAB_001376b3;
        }
      }
      if (bVar1 != 0x5d) goto LAB_001376e7;
LAB_001376da:
      end_array(this,parser);
      goto LAB_00137708;
    }
  }
  __return_storage_ptr__->second = bVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            array_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_array_member);
                    return {nullptr, true};
                }
                char const c = *ch;
                switch (this->get_state ()) {
                case start_state:
                    PSTORE_ASSERT (c == '[');
                    if (this->set_error (parser, parser.callbacks ().begin_array ())) {
                        break;
                    }
                    this->set_state (first_object_state);
                    // Match this character and consume whitespace before the object (or close
                    // bracket).
                    return {this->make_whitespace_matcher (parser), true};

                case first_object_state:
                    if (c == ']') {
                        this->end_array (parser);
                        break;
                    }
                    PSTORE_FALLTHROUGH;
                case object_state:
                    this->set_state (comma_state);
                    return {this->make_root_matcher (parser), false};
                    break;
                case comma_state:
                    if (isspace (c)) {
                        // just consume whitespace before a comma.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    switch (c) {
                    case ',':
                        this->set_state (
                            (parser.extension_enabled (extensions::array_trailing_comma))
                                ? first_object_state
                                : object_state);
                        return {this->make_whitespace_matcher (parser), true};
                    case ']': this->end_array (parser); break;
                    default: this->set_error (parser, error_code::expected_array_member); break;
                    }
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, true};
            }